

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

void af_iup_shift(AF_Point_conflict p1,AF_Point_conflict p2,AF_Point_conflict ref)

{
  long lVar1;
  FT_Pos delta;
  AF_Point_conflict p;
  AF_Point_conflict ref_local;
  AF_Point_conflict p2_local;
  AF_Point_conflict p1_local;
  
  lVar1 = ref->u - ref->v;
  delta = (FT_Pos)p1;
  if (lVar1 != 0) {
    for (; (ulong)delta < ref; delta = delta + 0x50) {
      *(long *)(delta + 0x30) = *(long *)(delta + 0x38) + lVar1;
    }
    for (delta = (FT_Pos)(ref + 1); (ulong)delta <= p2; delta = delta + 0x50) {
      *(long *)(delta + 0x30) = *(long *)(delta + 0x38) + lVar1;
    }
  }
  return;
}

Assistant:

static void
  af_iup_shift( AF_Point  p1,
                AF_Point  p2,
                AF_Point  ref )
  {
    AF_Point  p;
    FT_Pos    delta = ref->u - ref->v;


    if ( delta == 0 )
      return;

    for ( p = p1; p < ref; p++ )
      p->u = p->v + delta;

    for ( p = ref + 1; p <= p2; p++ )
      p->u = p->v + delta;
  }